

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::InodeFileConfig_MountPointMappingEntry::
~InodeFileConfig_MountPointMappingEntry(InodeFileConfig_MountPointMappingEntry *this)

{
  ~InodeFileConfig_MountPointMappingEntry(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

InodeFileConfig_MountPointMappingEntry::~InodeFileConfig_MountPointMappingEntry() = default;